

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O0

int SetTask(void)

{
  int iVar1;
  time_t start_00;
  ostream *poVar2;
  string local_58 [8];
  string input;
  string local_38 [8];
  string word;
  time_t start;
  
  start_00 = time((time_t *)0x0);
  std::__cxx11::string::string
            (local_38,(string *)(currentArray_abi_cxx11_ + (start_00 % 100) * 0x20));
  std::__cxx11::string::string(local_58);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_98a + 0xf);
  poVar2 = std::operator<<(poVar2,local_38);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_58);
  iVar1 = WriteCheck((string *)local_38,(string *)local_58);
  if (iVar1 == 0) {
    TimerCheck(start_00);
    iVar1 = TimerCheck(start_00);
    if (0 < iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_9cc);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      iVar1 = TimerCheck(start_00);
      Points = Points + iVar1;
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_9e2);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,Points);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      goto LAB_0010518a;
    }
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_9ec);
  }
  iVar1 = WriteCheck((string *)local_38,(string *)local_58);
  if (iVar1 == 1) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_a02);
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_a18);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Flag = 0;
  }
LAB_0010518a:
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int SetTask()
{

    time_t start = time(NULL);
    // cout << start << endl;
    string word = currentArray[start % 100];
    string input;
    cout << "Пиши слово : " << word << endl;
    cin >> input;
    if (WriteCheck(word, input) == 0) {
        TimerCheck(start);
        if (TimerCheck(start) > 0) {
            cout << "Молодец" << endl;
            Points += TimerCheck(start);
            cout << "Очков=" << Points << endl;
            return 0;
        } else {
            cout << "Не влез во время";
        }
    }
    if (WriteCheck(word, input) == 1) {
        cout << "Не верно,ты опечатался\n";
        cout << "Ты проиграл" << endl;
        Flag = 0;
        return 0;
    } else
        ;

    return 0;
}